

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O2

int mbedtls_ecjpake_setup
              (mbedtls_ecjpake_context *ctx,mbedtls_ecjpake_role role,mbedtls_md_type_t hash,
              mbedtls_ecp_group_id curve,uchar *secret,size_t len)

{
  int iVar1;
  mbedtls_md_info_t *pmVar2;
  
  iVar1 = -0x4f80;
  if (role < MBEDTLS_ECJPAKE_NONE) {
    ctx->role = role;
    pmVar2 = mbedtls_md_info_from_type(hash);
    if (pmVar2 == (mbedtls_md_info_t *)0x0) {
      iVar1 = -0x5080;
    }
    else {
      ctx->md_type = hash;
      iVar1 = mbedtls_ecp_group_load(&ctx->grp,curve);
      if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_read_binary(&ctx->s,secret,len), iVar1 == 0)) {
        return 0;
      }
      mbedtls_ecjpake_free(ctx);
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecjpake_setup(mbedtls_ecjpake_context *ctx,
                          mbedtls_ecjpake_role role,
                          mbedtls_md_type_t hash,
                          mbedtls_ecp_group_id curve,
                          const unsigned char *secret,
                          size_t len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (role != MBEDTLS_ECJPAKE_CLIENT && role != MBEDTLS_ECJPAKE_SERVER) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    ctx->role = role;

    if ((mbedtls_md_info_from_type(hash)) == NULL) {
        return MBEDTLS_ERR_MD_FEATURE_UNAVAILABLE;
    }

    ctx->md_type = hash;

    MBEDTLS_MPI_CHK(mbedtls_ecp_group_load(&ctx->grp, curve));

    MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&ctx->s, secret, len));

cleanup:
    if (ret != 0) {
        mbedtls_ecjpake_free(ctx);
    }

    return ret;
}